

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attributes_decoder.cc
# Opt level: O1

bool __thiscall
draco::AttributesDecoder::DecodeAttributesDecoderData
          (AttributesDecoder *this,DecoderBuffer *in_buffer)

{
  long lVar1;
  byte bVar2;
  char cVar3;
  byte num_components;
  char cVar4;
  ushort uVar5;
  long lVar6;
  AttributesDecoder *pAVar7;
  PointCloud *this_00;
  bool bVar8;
  int32_t iVar9;
  int iVar10;
  tuple<draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_> this_01;
  DataType dt;
  vector<int,_std::allocator<int>_> *this_02;
  ulong __new_size;
  uint32_t i;
  ulong uVar11;
  __uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> local_b8;
  uint32_t unique_id;
  ushort local_a6;
  uint32_t num_attributes;
  AttributesDecoder *local_a0;
  value_type_conflict1 local_94;
  PointCloud *local_90;
  vector<int,_std::allocator<int>_> *local_88;
  ulong local_80;
  vector<int,_std::allocator<int>_> *local_78;
  GeometryAttribute ga;
  
  local_a0 = this;
  if (this->point_cloud_decoder_->version_major_ < 2) {
    lVar1 = in_buffer->pos_ + 4;
    if (in_buffer->data_size_ < lVar1) {
      return false;
    }
    num_attributes = *(uint32_t *)(in_buffer->data_ + in_buffer->pos_);
    in_buffer->pos_ = lVar1;
  }
  else {
    bVar8 = anon_unknown_13::DecodeVarintUnsigned<unsigned_int>(1,&num_attributes,in_buffer);
    if (!bVar8) {
      return false;
    }
  }
  pAVar7 = local_a0;
  __new_size = (ulong)num_attributes;
  if ((__new_size != 0) && ((long)__new_size <= (in_buffer->data_size_ - in_buffer->pos_) * 5)) {
    this_02 = &local_a0->point_attribute_ids_;
    std::vector<int,_std::allocator<int>_>::resize(this_02,__new_size);
    local_90 = pAVar7->point_cloud_;
    local_88 = &pAVar7->point_attribute_to_local_id_map_;
    uVar11 = 0;
    local_78 = this_02;
    local_80 = __new_size;
    while( true ) {
      lVar6 = in_buffer->data_size_;
      lVar1 = in_buffer->pos_ + 1;
      if (lVar6 < lVar1) break;
      bVar2 = in_buffer->data_[in_buffer->pos_];
      in_buffer->pos_ = lVar1;
      lVar1 = in_buffer->pos_ + 1;
      if (lVar6 < lVar1) {
        return false;
      }
      cVar3 = in_buffer->data_[in_buffer->pos_];
      local_78 = (vector<int,_std::allocator<int>_> *)CONCAT71((int7)((ulong)local_78 >> 8),cVar3);
      in_buffer->pos_ = lVar1;
      lVar1 = in_buffer->pos_ + 1;
      if (lVar6 < lVar1) {
        return false;
      }
      num_components = in_buffer->data_[in_buffer->pos_];
      in_buffer->pos_ = lVar1;
      lVar1 = in_buffer->pos_ + 1;
      if (lVar6 < lVar1) {
        return false;
      }
      cVar4 = in_buffer->data_[in_buffer->pos_];
      in_buffer->pos_ = lVar1;
      if (4 < bVar2) {
        return false;
      }
      if ((byte)(cVar3 - 0xcU) < 0xf5) {
        return false;
      }
      if (num_components == 0) {
        return false;
      }
      dt = (DataType)local_78 & 0xff;
      GeometryAttribute::GeometryAttribute(&ga);
      iVar9 = DataTypeLength(dt);
      GeometryAttribute::Init
                (&ga,(uint)bVar2,(DataBuffer *)0x0,num_components,dt,cVar4 != '\0',
                 (long)(int)(iVar9 * (uint)num_components),0);
      uVar5._0_1_ = local_a0->point_cloud_decoder_->version_major_;
      uVar5._1_1_ = local_a0->point_cloud_decoder_->version_minor_;
      if ((ushort)(uVar5 << 8 | uVar5 >> 8) < 0x103) {
        lVar1 = in_buffer->pos_ + 2;
        if (in_buffer->data_size_ < lVar1) {
          return false;
        }
        local_a6 = *(ushort *)(in_buffer->data_ + in_buffer->pos_);
        in_buffer->pos_ = lVar1;
        unique_id = (uint32_t)local_a6;
      }
      else {
        bVar8 = anon_unknown_13::DecodeVarintUnsigned<unsigned_int>(1,&unique_id,in_buffer);
        if (!bVar8) {
          return false;
        }
      }
      this_00 = local_90;
      ga.unique_id_ = unique_id;
      this_01.
      super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>.
      super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>)
           operator_new(0x70);
      PointAttribute::PointAttribute
                ((PointAttribute *)
                 this_01.
                 super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                 .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl,&ga);
      local_b8._M_t.
      super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>.
      super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl =
           (tuple<draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>)
           (tuple<draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>)
           this_01.
           super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
           .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl;
      iVar10 = PointCloud::AddAttribute
                         (this_00,(unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                                   *)&local_b8);
      if ((_Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>)
          local_b8._M_t.
          super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
          .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl !=
          (PointAttribute *)0x0) {
        std::default_delete<draco::PointAttribute>::operator()
                  ((default_delete<draco::PointAttribute> *)&local_b8,
                   (PointAttribute *)
                   local_b8._M_t.
                   super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                   .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl);
      }
      local_b8._M_t.
      super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>.
      super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl =
           (tuple<draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>)
           (_Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>)
           0x0;
      *(uint32_t *)
       ((long)(this_00->attributes_).
              super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[iVar10]._M_t.
              super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
              ._M_t + 0x3c) = unique_id;
      (local_a0->point_attribute_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar11] = iVar10;
      if ((int)((ulong)((long)(local_a0->point_attribute_to_local_id_map_).
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(local_a0->point_attribute_to_local_id_map_).
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 2) <= iVar10) {
        local_94 = -1;
        std::vector<int,_std::allocator<int>_>::resize(local_88,(long)(iVar10 + 1),&local_94);
      }
      (local_88->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_start[iVar10] = (int)uVar11;
      uVar11 = uVar11 + 1;
      if (local_80 == uVar11) {
        return local_80 <= uVar11;
      }
    }
  }
  return false;
}

Assistant:

bool AttributesDecoder::DecodeAttributesDecoderData(DecoderBuffer *in_buffer) {
  // Decode and create attributes.
  uint32_t num_attributes;
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
  if (point_cloud_decoder_->bitstream_version() <
      DRACO_BITSTREAM_VERSION(2, 0)) {
    if (!in_buffer->Decode(&num_attributes)) {
      return false;
    }
  } else
#endif
  {
    if (!DecodeVarint(&num_attributes, in_buffer)) {
      return false;
    }
  }

  // Check that decoded number of attributes is valid.
  if (num_attributes == 0) {
    return false;
  }
  if (num_attributes > 5 * in_buffer->remaining_size()) {
    // The decoded number of attributes is unreasonably high, because at least
    // five bytes of attribute descriptor data per attribute are expected.
    return false;
  }

  // Decode attribute descriptor data.
  point_attribute_ids_.resize(num_attributes);
  PointCloud *pc = point_cloud_;
  for (uint32_t i = 0; i < num_attributes; ++i) {
    // Decode attribute descriptor data.
    uint8_t att_type, data_type, num_components, normalized;
    if (!in_buffer->Decode(&att_type)) {
      return false;
    }
    if (!in_buffer->Decode(&data_type)) {
      return false;
    }
    if (!in_buffer->Decode(&num_components)) {
      return false;
    }
    if (!in_buffer->Decode(&normalized)) {
      return false;
    }
    if (att_type >= GeometryAttribute::NAMED_ATTRIBUTES_COUNT) {
      return false;
    }
    if (data_type == DT_INVALID || data_type >= DT_TYPES_COUNT) {
      return false;
    }

    // Check decoded attribute descriptor data.
    if (num_components == 0) {
      return false;
    }

    // Add the attribute to the point cloud.
    const DataType draco_dt = static_cast<DataType>(data_type);
    GeometryAttribute ga;
    ga.Init(static_cast<GeometryAttribute::Type>(att_type), nullptr,
            num_components, draco_dt, normalized > 0,
            DataTypeLength(draco_dt) * num_components, 0);
    uint32_t unique_id;
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
    if (point_cloud_decoder_->bitstream_version() <
        DRACO_BITSTREAM_VERSION(1, 3)) {
      uint16_t custom_id;
      if (!in_buffer->Decode(&custom_id)) {
        return false;
      }
      // TODO(draco-eng): Add "custom_id" to attribute metadata.
      unique_id = static_cast<uint32_t>(custom_id);
      ga.set_unique_id(unique_id);
    } else
#endif
    {
      if (!DecodeVarint(&unique_id, in_buffer)) {
        return false;
      }
      ga.set_unique_id(unique_id);
    }
    const int att_id = pc->AddAttribute(
        std::unique_ptr<PointAttribute>(new PointAttribute(ga)));
    pc->attribute(att_id)->set_unique_id(unique_id);
    point_attribute_ids_[i] = att_id;

    // Update the inverse map.
    if (att_id >=
        static_cast<int32_t>(point_attribute_to_local_id_map_.size())) {
      point_attribute_to_local_id_map_.resize(att_id + 1, -1);
    }
    point_attribute_to_local_id_map_[att_id] = i;
  }
  return true;
}